

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.h
# Opt level: O3

void anurbs::Interval::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Interval> *pcVar1;
  class_<anurbs::Interval> local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  arg local_c8;
  code *local_b8;
  undefined8 local_b0;
  arg local_a8;
  code *local_98;
  undefined8 local_90;
  arg local_88;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  code *local_18;
  undefined8 local_10;
  
  pybind11::class_<anurbs::Interval>::class_<>
            (&local_f0,(m->super_object).super_handle.m_ptr,"Interval");
  pybind11::class_<anurbs::Interval>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor>
            (&local_f0,"__init__",(type *)&local_d8,(is_new_style_constructor *)&local_e8);
  local_d8 = t0;
  local_d0 = 0;
  local_e8 = set_t0;
  local_e0 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property<double(anurbs::Interval::*)()const,void(anurbs::Interval::*)(double)>
                     (&local_f0,"t0",(offset_in_Model_to_subr *)&local_d8,
                      (offset_in_Model_to_subr *)&local_e8);
  local_18 = t1;
  local_10 = 0;
  local_28 = set_t1;
  local_20 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property<double(anurbs::Interval::*)()const,void(anurbs::Interval::*)(double)>
                     (pcVar1,"t1",(offset_in_Model_to_subr *)&local_18,
                      (offset_in_Model_to_subr *)&local_28);
  local_38 = min;
  local_30 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property_readonly<double(anurbs::Interval::*)()const>
                     (pcVar1,"min",(offset_in_Model_to_subr *)&local_38);
  local_48 = max;
  local_40 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property_readonly<double(anurbs::Interval::*)()const>
                     (pcVar1,"max",(offset_in_Model_to_subr *)&local_48);
  local_58 = delta;
  local_50 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property_readonly<double(anurbs::Interval::*)()const>
                     (pcVar1,"delta",(offset_in_Model_to_subr *)&local_58);
  local_68 = length;
  local_60 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property_readonly<double(anurbs::Interval::*)()const>
                     (pcVar1,"length",(offset_in_Model_to_subr *)&local_68);
  local_78 = normalized_at;
  local_70 = 0;
  local_88.name = "t";
  local_88._8_1_ = 2;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def<double(anurbs::Interval::*)(double)const,pybind11::arg>
                     (pcVar1,"normalized_at",(offset_in_Model_to_subr *)&local_78,&local_88);
  local_98 = parameter_at_normalized;
  local_90 = 0;
  local_a8.name = "t";
  local_a8._8_1_ = 2;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def<double(anurbs::Interval::*)(double)const,pybind11::arg>
                     (pcVar1,"parameter_at_normalized",(offset_in_Model_to_subr *)&local_98,
                      &local_a8);
  local_b8 = clamp;
  local_b0 = 0;
  local_c8.name = "t";
  local_c8._8_1_ = 2;
  pybind11::class_<anurbs::Interval>::def<double(anurbs::Interval::*)(double)const,pybind11::arg>
            (pcVar1,"clamp",(offset_in_Model_to_subr *)&local_b8,&local_c8);
  pybind11::object::~object((object *)&local_f0);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Interval;

        py::class_<Type>(m, "Interval")
            .def(py::init<double, double>())
            .def_property("t0", &Type::t0, &Type::set_t0)
            .def_property("t1", &Type::t1, &Type::set_t1)
            .def_property_readonly("min", &Type::min)
            .def_property_readonly("max", &Type::max)
            .def_property_readonly("delta", &Type::delta)
            .def_property_readonly("length", &Type::length)
            .def("normalized_at", &Type::normalized_at,
                "t"_a)
            .def("parameter_at_normalized", py::overload_cast<const double>(
                &Type::parameter_at_normalized, py::const_), "t"_a)
            .def("clamp", (double (Type::*)(const double) const) &Type::clamp,
                "t"_a)
        ;
    }